

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

Gia_Man_t * Gia_ManDupUnnormalize(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  char *pcVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  Vec_Int_t *__ptr;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  int *piVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  uint uVar12;
  long lVar13;
  int iVar14;
  ulong uVar11;
  
  if (p->nBufs != 0) {
    __assert_fail("!Gia_ManBufNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x183,"Gia_Man_t *Gia_ManDupUnnormalize(Gia_Man_t *)");
  }
  __ptr = Gia_ManOrderWithBoxes(p);
  if (__ptr == (Vec_Int_t *)0x0) {
    p_00 = (Gia_Man_t *)0x0;
  }
  else {
    Gia_ManFillValue(p);
    p_00 = Gia_ManStart(p->nObjs);
    pcVar2 = p->pName;
    if (pcVar2 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 1);
      strcpy(pcVar7,pcVar2);
    }
    p_00->pName = pcVar7;
    pcVar2 = p->pSpec;
    if (pcVar2 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 1);
      strcpy(pcVar7,pcVar2);
    }
    p_00->pSpec = pcVar7;
    if (p->pSibls != (int *)0x0) {
      piVar8 = (int *)calloc((long)p->nObjs,4);
      p_00->pSibls = piVar8;
    }
    if (0 < __ptr->nSize) {
      lVar13 = 0;
      do {
        iVar14 = __ptr->pArray[lVar13];
        if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) {
LAB_0077be12:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar1 = p->pObjs + iVar14;
        uVar3 = *(ulong *)pGVar1;
        uVar5 = (uint)uVar3;
        uVar10 = uVar5 & 0x1fffffff;
        uVar11 = (ulong)uVar10;
        uVar12 = (uint)(uVar3 >> 0x20);
        if ((((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar5 & 0x1fffffff) != (uVar12 & 0x1fffffff))) {
          if (uVar10 == 0x1fffffff || (int)uVar5 < 0) {
            if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
              pGVar9 = Gia_ManAppendObj(p_00);
              uVar3 = *(ulong *)pGVar9;
              *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
              *(ulong *)pGVar9 =
                   uVar3 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar4 = p_00->pObjs;
              if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) {
LAB_0077be50:
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
              Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555)
              ;
              pGVar4 = p_00->pObjs;
              if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_0077be50;
              pGVar1->Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
            }
            else {
              if ((int)uVar5 < 0 && uVar10 != 0x1fffffff) {
                if ((int)pGVar1[-uVar11].Value < 0) goto LAB_0077be31;
                uVar5 = Gia_ManAppendCo(p_00,pGVar1[-uVar11].Value ^ uVar5 >> 0x1d & 1);
                goto LAB_0077bb95;
              }
              if ((~uVar3 & 0x1fffffff1fffffff) != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                              ,0x19d,"Gia_Man_t *Gia_ManDupUnnormalize(Gia_Man_t *)");
              }
              pGVar1->Value = 0;
            }
          }
          else {
            if (((int)pGVar1[-uVar11].Value < 0) ||
               ((int)pGVar1[-(ulong)(uVar12 & 0x1fffffff)].Value < 0)) goto LAB_0077be31;
            uVar5 = Gia_ManAppendAnd(p_00,pGVar1[-uVar11].Value ^ (uint)(uVar3 >> 0x1d) & 1,
                                     pGVar1[-(ulong)(uVar12 & 0x1fffffff)].Value ^
                                     uVar12 >> 0x1d & 1);
            pGVar1->Value = uVar5;
            pGVar4 = p->pObjs;
            if ((pGVar1 < pGVar4) || (pGVar4 + p->nObjs <= pGVar1)) goto LAB_0077be50;
            piVar8 = p->pSibls;
            if ((piVar8 != (int *)0x0) &&
               (iVar14 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555, piVar8[iVar14] != 0)
               ) {
              iVar14 = piVar8[iVar14];
              if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_0077be12;
              if (((int)pGVar4[iVar14].Value < 0) || ((int)uVar5 < 0)) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf2,"int Abc_Lit2Var(int)");
              }
              p_00->pSibls[uVar5 >> 1] = pGVar4[iVar14].Value >> 1;
            }
          }
        }
        else {
          if ((int)pGVar1[-uVar11].Value < 0) {
LAB_0077be31:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf5,"int Abc_LitNotCond(int, int)");
          }
          uVar5 = Gia_ManAppendBuf(p_00,pGVar1[-uVar11].Value ^ uVar5 >> 0x1d & 1);
LAB_0077bb95:
          pGVar1->Value = uVar5;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < __ptr->nSize);
    }
    Gia_ManSetRegNum(p_00,p->nRegs);
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    free(__ptr);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupUnnormalize( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( !Gia_ManBufNum(p) );
    vNodes = Gia_ManOrderWithBoxes( p );
    if ( vNodes == NULL )
        return NULL;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
                pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);        
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsConst0(pObj) )
            pObj->Value = 0;
        else assert( 0 );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vNodes );
    return pNew;
}